

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QList<QtPromise::QPromise<int>_>_>::
reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<QList<QtPromise::QPromise<int>_>_> *this,exception_ptr *error)

{
  QPromise<QList<QtPromise::QPromise<int>_>_> *pQVar1;
  Data *pDVar2;
  PromiseData<QList<QtPromise::QPromise<int>_>_> *pPVar3;
  QPromise<QList<QtPromise::QPromise<int>_>_> *promise;
  exception_ptr *error_local;
  PromiseResolver<QList<QtPromise::QPromise<int>_>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QtPromise::QPromise<int>_>_>::Data>
           ::operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<QList<QtPromise::QPromise<int>_>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QtPromise::QPromise<int>_>_>_>
             ::operator->(&(pQVar1->super_QPromiseBase<QList<QtPromise::QPromise<int>_>_>).m_d);
    PromiseDataBase<QList<QtPromise::QPromise<int>_>,_void_(const_QList<QtPromise::QPromise<int>_>_&)>
    ::reject<std::__exception_ptr::exception_ptr>
              (&pPVar3->
                super_PromiseDataBase<QList<QtPromise::QPromise<int>_>,_void_(const_QList<QtPromise::QPromise<int>_>_&)>
               ,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QtPromise::QPromise<int>_>_>_>
             ::operator->(&(pQVar1->super_QPromiseBase<QList<QtPromise::QPromise<int>_>_>).m_d);
    PromiseDataBase<QList<QtPromise::QPromise<int>_>,_void_(const_QList<QtPromise::QPromise<int>_>_&)>
    ::dispatch(&pPVar3->
                super_PromiseDataBase<QList<QtPromise::QPromise<int>_>,_void_(const_QList<QtPromise::QPromise<int>_>_&)>
              );
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }